

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_zTXt(ucvector *out,char *keyword,char *textstring,
                  LodePNGCompressSettings *zlibsettings)

{
  size_t insize;
  size_t textsize;
  size_t i;
  ucvector compressed;
  ucvector data;
  uint error;
  LodePNGCompressSettings *zlibsettings_local;
  char *textstring_local;
  char *keyword_local;
  ucvector *out_local;
  
  insize = strlen(textstring);
  ucvector_init((ucvector *)&compressed.allocsize);
  ucvector_init((ucvector *)&i);
  for (textsize = 0; keyword[textsize] != '\0'; textsize = textsize + 1) {
    ucvector_push_back((ucvector *)&compressed.allocsize,keyword[textsize]);
  }
  if ((textsize == 0) || (0x4f < textsize)) {
    out_local._4_4_ = 0x59;
  }
  else {
    ucvector_push_back((ucvector *)&compressed.allocsize,'\0');
    ucvector_push_back((ucvector *)&compressed.allocsize,'\0');
    data.allocsize._4_4_ =
         zlib_compress((uchar **)&i,(size_t *)&compressed,(uchar *)textstring,insize,zlibsettings);
    if (data.allocsize._4_4_ == 0) {
      for (textsize = 0; (uchar *)textsize != compressed.data; textsize = textsize + 1) {
        ucvector_push_back((ucvector *)&compressed.allocsize,*(uchar *)(i + textsize));
      }
      data.allocsize._4_4_ = addChunk(out,"zTXt",(uchar *)compressed.allocsize,(size_t)data.data);
    }
    ucvector_cleanup(&i);
    ucvector_cleanup(&compressed.allocsize);
    out_local._4_4_ = data.allocsize._4_4_;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_zTXt(ucvector* out, const char* keyword, const char* textstring,
                              LodePNGCompressSettings* zlibsettings)
{
  unsigned error = 0;
  ucvector data, compressed;
  size_t i, textsize = strlen(textstring);

  ucvector_init(&data);
  ucvector_init(&compressed);
  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&data, 0); /*0 termination char*/
  ucvector_push_back(&data, 0); /*compression method: 0*/

  error = zlib_compress(&compressed.data, &compressed.size,
                        (unsigned char*)textstring, textsize, zlibsettings);
  if(!error)
  {
    for(i = 0; i != compressed.size; ++i) ucvector_push_back(&data, compressed.data[i]);
    error = addChunk(out, "zTXt", data.data, data.size);
  }

  ucvector_cleanup(&compressed);
  ucvector_cleanup(&data);
  return error;
}